

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O2

ProductionPtr __thiscall
avro::parsing::ValidatingGrammarGenerator::doGenerate
          (ValidatingGrammarGenerator *this,NodePtr *n,
          map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m)

{
  element_type *peVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  ValidatingGrammarGenerator this_00;
  int iVar4;
  E *p;
  iterator iVar5;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *pvVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  size_t s;
  mapped_type *pmVar8;
  Exception *this_01;
  _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *in_RCX;
  shared_count sVar9;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *extraout_RDX_01;
  sp_counted_base *extraout_RDX_02;
  sp_counted_base *extraout_RDX_03;
  ulong uVar10;
  ProductionPtr *result;
  ulong uVar11;
  type tVar12;
  ProductionPtr PVar13;
  shared_ptr<avro::NodeSymbolic> ns;
  NodePtr nn;
  _Alloc_hider local_68;
  any aaStack_60 [2];
  int local_4c;
  _Alloc_hider local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  local_38;
  
  peVar1 = *(element_type **)&(m->_M_t)._M_impl;
  switch((peVar1->super_NodeImplSymbolic).super_Node.type_) {
  case AVRO_STRING:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,7);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_BYTES:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,8);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_INT:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,3);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_LONG:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,4);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_FLOAT:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,5);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_DOUBLE:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,6);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_BOOL:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,2);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_NULL:
    nn.px._0_4_ = 1;
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,1);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    tVar12 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&nn,(Symbol *)&ns);
    sVar9 = tVar12.pn.pi_;
    break;
  case AVRO_RECORD:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    std::
    _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
    ::erase(in_RCX,(key_type *)m);
    uVar11 = (**(code **)(**(long **)&(m->_M_t)._M_impl + 0x20))();
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      plVar3 = *(long **)&(m->_M_t)._M_impl;
      uVar7 = (**(code **)(*plVar3 + 0x28))(plVar3,uVar10 & 0xffffffff);
      (*(code *)n->px->_vptr_Node)(&ns,n,uVar7);
      local_38.current._M_current._0_4_ = ((ns.px)->super_NodeImplSymbolic).super_Node.type_;
      local_38.current._M_current._4_1_ = ((ns.px)->super_NodeImplSymbolic).super_Node.locked_;
      local_38.current._M_current._5_3_ =
           *(undefined3 *)&((ns.px)->super_NodeImplSymbolic).super_Node.field_0xd;
      local_40.current._M_current =
           (__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            )((ns.px)->super_NodeImplSymbolic).super_Node._vptr_Node;
      std::
      copy<std::reverse_iterator<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>,std::back_insert_iterator<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                (&local_38,&local_40,
                 (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                 this->_vptr_ValidatingGrammarGenerator);
      boost::detail::shared_count::~shared_count(&ns.pn);
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              (*this->_vptr_ValidatingGrammarGenerator,this->_vptr_ValidatingGrammarGenerator[1]);
    pmVar8 = std::
             map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                           *)in_RCX,(key_type *)m);
    goto LAB_0016de9e;
  case AVRO_ENUM:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    pvVar6 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    s = (**(code **)(**(long **)&(m->_M_t)._M_impl + 0x38))();
    Symbol::sizeCheckSymbol((Symbol *)&ns,s);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar6,(Symbol *)&ns);
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,0xe);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&ns);
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    pmVar8 = std::
             map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                           *)in_RCX,(key_type *)m);
    goto LAB_0016de9e;
  case AVRO_ARRAY:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,10);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&ns);
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    pvVar6 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    plVar3 = *(long **)&(m->_M_t)._M_impl;
    uVar7 = (**(code **)(*plVar3 + 0x28))(plVar3,0);
    (*(code *)n->px->_vptr_Node)(&nn,n,uVar7);
    Symbol::repeater((Symbol *)&ns,(ProductionPtr *)&nn,true);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar6,(Symbol *)&ns);
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    boost::detail::shared_count::~shared_count(&nn.pn);
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,9);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&ns);
    sVar9.pi_ = extraout_RDX;
    break;
  case AVRO_MAP:
    iVar4 = (*(peVar1->super_NodeImplSymbolic).super_Node._vptr_Node[5])(peVar1,1);
    (*(code *)n->px->_vptr_Node)(&ns,n,iVar4);
    pvVar6 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             operator_new(0x18);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::vector
              (pvVar6,(vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)ns.px
              );
    boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
    shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
              ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                *)&nn,pvVar6);
    local_68._M_p._0_4_ = 7;
    aaStack_60[0].content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               CONCAT44(nn.px._4_4_,nn.px._0_4_),(Symbol *)&local_68);
    if (aaStack_60[0].content != (placeholder *)0x0) {
      (*(aaStack_60[0].content)->_vptr_placeholder[1])();
    }
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    local_68._M_p._0_4_ = 0xc;
    aaStack_60[0].content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&local_68);
    if (aaStack_60[0].content != (placeholder *)0x0) {
      (*(aaStack_60[0].content)->_vptr_placeholder[1])();
    }
    pvVar6 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    Symbol::repeater((Symbol *)&local_68,(ProductionPtr *)&nn,false);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar6,(Symbol *)&local_68);
    if (aaStack_60[0].content != (placeholder *)0x0) {
      (*(aaStack_60[0].content)->_vptr_placeholder[1])();
    }
    local_68._M_p._0_4_ = 0xb;
    aaStack_60[0].content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&local_68);
    if (aaStack_60[0].content != (placeholder *)0x0) {
      (*(aaStack_60[0].content)->_vptr_placeholder[1])();
    }
    boost::detail::shared_count::~shared_count(&nn.pn);
    goto LAB_0016df17;
  case AVRO_UNION:
    ns.px = (element_type *)0x0;
    ns.pn.pi_ = (sp_counted_base *)0x0;
    iVar4 = (*(peVar1->super_NodeImplSymbolic).super_Node._vptr_Node[4])(peVar1);
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::reserve((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               *)&ns,CONCAT44(extraout_var,iVar4));
    local_48._M_p = (pointer)this;
    for (uVar11 = 0; this = (ValidatingGrammarGenerator *)local_48._M_p,
        CONCAT44(extraout_var,iVar4) != uVar11; uVar11 = uVar11 + 1) {
      plVar3 = *(long **)&(m->_M_t)._M_impl;
      uVar7 = (**(code **)(*plVar3 + 0x28))(plVar3,uVar11 & 0xffffffff);
      (*(code *)n->px->_vptr_Node)(&nn,n,uVar7);
      std::
      vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
      ::
      emplace_back<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
                  *)&ns,(shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                         *)&nn);
      boost::detail::shared_count::~shared_count(&nn.pn);
    }
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    this_00._vptr_ValidatingGrammarGenerator = this->_vptr_ValidatingGrammarGenerator;
    Symbol::alternative((Symbol *)&nn,
                        (vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                         *)&ns);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this_00._vptr_ValidatingGrammarGenerator,(Symbol *)&nn);
    if (nn.pn.pi_ != (sp_counted_base *)0x0) {
      (*(nn.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    nn.px._0_4_ = 0xf;
    nn.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&nn);
    if (nn.pn.pi_ != (sp_counted_base *)0x0) {
      (*(nn.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::~vector((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               *)&ns);
    sVar9.pi_ = extraout_RDX_01;
    goto LAB_0016df1c;
  case AVRO_FIXED:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    pvVar6 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    iVar4 = (**(code **)(**(long **)&(m->_M_t)._M_impl + 0x50))();
    Symbol::sizeCheckSymbol((Symbol *)&ns,(long)iVar4);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar6,(Symbol *)&ns);
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    ns.px = (element_type *)CONCAT44(ns.px._4_4_,0xd);
    ns.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)&ns);
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    pmVar8 = std::
             map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                           *)in_RCX,(key_type *)m);
LAB_0016de9e:
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator=(pmVar8,(shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                      *)this);
    sVar9.pi_ = extraout_RDX_02;
    goto LAB_0016df1c;
  case AVRO_NUM_TYPES:
    ns.pn.pi_ = *(sp_counted_base **)&(m->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (ns.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (ns.pn.pi_)->use_count_ = (ns.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    ns.px = peVar1;
    NodeSymbolic::getNode((NodeSymbolic *)&nn);
    iVar5 = std::
            _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
            ::find(in_RCX,&nn);
    if (((_Rb_tree_header *)iVar5._M_node == &(in_RCX->_M_impl).super__Rb_tree_header) ||
       (iVar5._M_node[1]._M_left == (_Base_ptr)0x0)) {
      local_68._M_p = (pointer)0x0;
      aaStack_60[0].content = (placeholder *)0x0;
      pmVar8 = std::
               map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                             *)in_RCX,&nn);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::operator=(pmVar8,(shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                          *)&local_68);
      boost::detail::shared_count::~shared_count((shared_count *)aaStack_60);
      local_4c = 1;
      Symbol::placeholder<boost::shared_ptr<avro::Node>>((Symbol *)&local_68,&nn);
      boost::
      make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                ((boost *)this,&local_4c,(Symbol *)&local_68);
      if (aaStack_60[0].content != (placeholder *)0x0) {
        (*(aaStack_60[0].content)->_vptr_placeholder[1])();
      }
    }
    else {
      this->_vptr_ValidatingGrammarGenerator = (_func_int **)iVar5._M_node[1]._M_left;
      p_Var2 = iVar5._M_node[1]._M_right;
      this[1]._vptr_ValidatingGrammarGenerator = (_func_int **)p_Var2;
      if (p_Var2 != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        UNLOCK();
      }
    }
    boost::detail::shared_count::~shared_count(&nn.pn);
LAB_0016df17:
    boost::detail::shared_count::~shared_count(&ns.pn);
    sVar9.pi_ = extraout_RDX_03;
    goto LAB_0016df1c;
  default:
    this_01 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ns,"Unknown node type",(allocator<char> *)&nn);
    Exception::Exception(this_01,(string *)&ns);
    __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
  }
  if (ns.pn.pi_ != (sp_counted_base *)0x0) {
    (*(ns.pn.pi_)->_vptr_sp_counted_base[1])();
    sVar9.pi_ = extraout_RDX_00;
  }
LAB_0016df1c:
  PVar13.pn.pi_ = sVar9.pi_;
  PVar13.px = (element_type *)this;
  return PVar13;
}

Assistant:

ProductionPtr ValidatingGrammarGenerator::doGenerate(const NodePtr& n,
    map<NodePtr, ProductionPtr> &m) {
    switch (n->type()) {
    case AVRO_NULL:
        return make_shared<Production>(1, Symbol::nullSymbol());
    case AVRO_BOOL:
        return make_shared<Production>(1, Symbol::boolSymbol());
    case AVRO_INT:
        return make_shared<Production>(1, Symbol::intSymbol());
    case AVRO_LONG:
        return make_shared<Production>(1, Symbol::longSymbol());
    case AVRO_FLOAT:
        return make_shared<Production>(1, Symbol::floatSymbol());
    case AVRO_DOUBLE:
        return make_shared<Production>(1, Symbol::doubleSymbol());
    case AVRO_STRING:
        return make_shared<Production>(1, Symbol::stringSymbol());
    case AVRO_BYTES:
        return make_shared<Production>(1, Symbol::bytesSymbol());
    case AVRO_FIXED:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::sizeCheckSymbol(n->fixedSize()));
            result->push_back(Symbol::fixedSymbol());
            m[n] = result;
            return result;
        }
    case AVRO_RECORD:
        {
            ProductionPtr result = make_shared<Production>();

            m.erase(n);
            size_t c = n->leaves();
            for (size_t i = 0; i < c; ++i) {
                const NodePtr& leaf = n->leafAt(i);
                ProductionPtr v = doGenerate(leaf, m);
                copy(v->rbegin(), v->rend(), back_inserter(*result));
            }
            reverse(result->begin(), result->end());

            m[n] = result;
            return result;
        }
    case AVRO_ENUM:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::sizeCheckSymbol(n->names()));
            result->push_back(Symbol::enumSymbol());
            m[n] = result;
            return result;
        }
    case AVRO_ARRAY:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::arrayEndSymbol());
            result->push_back(Symbol::repeater(doGenerate(n->leafAt(0), m), true));
            result->push_back(Symbol::arrayStartSymbol());
            return result;
        }
    case AVRO_MAP:
        {
            ProductionPtr pp = doGenerate(n->leafAt(1), m);
			ProductionPtr v(new Production(*pp));
            v->push_back(Symbol::stringSymbol());
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::mapEndSymbol());
            result->push_back(Symbol::repeater(v, false));
            result->push_back(Symbol::mapStartSymbol());
            return result;
        }
    case AVRO_UNION:
        {
            vector<ProductionPtr> vv;
            size_t c = n->leaves();
            vv.reserve(c);
            for (size_t i = 0; i < c; ++i) {
                vv.push_back(doGenerate(n->leafAt(i), m));
            }
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::alternative(vv));
            result->push_back(Symbol::unionSymbol());
            return result;
        }
    case AVRO_SYMBOLIC:
        {
            shared_ptr<NodeSymbolic> ns = static_pointer_cast<NodeSymbolic>(n);
            NodePtr nn = ns->getNode();
            map<NodePtr, ProductionPtr>::iterator it =
                m.find(nn);
            if (it != m.end() && it->second) {
                return it->second;
            } else {
                m[nn] = ProductionPtr();
                return make_shared<Production>(1, Symbol::placeholder(nn));
            }
        }
    default:
        throw Exception("Unknown node type");
    }
}